

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLLinOp.cpp
# Opt level: O3

Any __thiscall amrex::MLLinOp::AnyMakeCoarseMG(MLLinOp *this,int amrlev,int mglev,IntVect *ng)

{
  long lVar1;
  int ncomp;
  _func_int **pp_Var2;
  undefined4 in_register_00000034;
  long *plVar3;
  IntVect *in_R8;
  long lVar4;
  IntVect ratio;
  BoxArray cba;
  IntVect local_258;
  FabFactory<amrex::FArrayBox> local_248;
  MFInfo local_240;
  BoxArray local_218;
  MultiFab local_1b0;
  
  plVar3 = (long *)CONCAT44(in_register_00000034,amrlev);
  lVar4 = (long)(int)ng;
  BoxArray::BoxArray(&local_218,
                     (BoxArray *)(lVar4 * 0x68 + *(long *)(plVar3[0x16] + (long)mglev * 0x18)));
  if (mglev < 1) {
    local_258.vect[2] = *(int *)(plVar3[0x10] + 8 + lVar4 * 0xc);
    local_258.vect._0_8_ = *(undefined8 *)(plVar3[0x10] + lVar4 * 0xc);
  }
  else {
    local_258.vect[0] = 2;
    local_258.vect[1] = 2;
    local_258.vect[2] = 2;
  }
  BoxArray::coarsen(&local_218,&local_258);
  BoxArray::convert(&local_218,(IntVect *)(plVar3 + 0xe));
  lVar1 = *(long *)(plVar3[0x19] + (long)mglev * 0x18);
  ncomp = (**(code **)(*plVar3 + 0x28))(plVar3);
  local_240.alloc = true;
  local_240._1_7_ = 0;
  local_240.arena = (Arena *)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.tags.
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0080b918;
  MultiFab::MultiFab(&local_1b0,&local_218,(DistributionMapping *)(lVar1 + lVar4 * 0x10),ncomp,in_R8
                     ,&local_240,&local_248);
  pp_Var2 = (_func_int **)operator_new(0x188);
  *pp_Var2 = (_func_int *)&PTR_Type_0080e380;
  MultiFab::MultiFab((MultiFab *)(pp_Var2 + 1),&local_1b0);
  this->_vptr_MLLinOp = pp_Var2;
  MultiFab::~MultiFab(&local_1b0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240.tags.
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           );
  BoxArray::~BoxArray(&local_218);
  return (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)
         (unique_ptr<amrex::Any::innards_base,_std::default_delete<amrex::Any::innards_base>_>)this;
}

Assistant:

Any
MLLinOp::AnyMakeCoarseMG (int amrlev, int mglev, IntVect const& ng) const
{
    BoxArray cba = m_grids[amrlev][mglev];
    IntVect ratio = (amrlev > 0) ? IntVect(2) : mg_coarsen_ratio_vec[mglev];
    cba.coarsen(ratio);
    cba.convert(m_ixtype);
    return Any(MultiFab(cba, m_dmap[amrlev][mglev], getNComp(), ng));
}